

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int writesimage(fitsfile *fptr,int *status)

{
  int iVar1;
  undefined8 local_68;
  long naxes [2];
  long naxis;
  double dStack_40;
  int bitpix;
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long ii;
  long nremain;
  int *status_local;
  fitsfile *fptr_local;
  
  local_68 = 3000;
  naxes[0] = 3000;
  nremain = (long)status;
  status_local = &fptr->HDUposition;
  iVar1 = ffcrim(fptr,0x10,2,&local_68,status);
  if (iVar1 != 0) {
    printerror(*(int *)nremain);
  }
  printf("\nWrite %dx%d I*2 image, %d pixels/loop:   ",3000,3000,20000);
  marktime((int *)nremain);
  ii = 9000000;
  for (_size = 1; _size <= ii; _size = _size + 20000) {
    ffppri(status_local,0,_size,20000,ssarray,nremain);
  }
  ffflus(status_local,nremain);
  gettime(&stack0xffffffffffffffc0,(float *)((long)&elapse + 4),(int *)nremain);
  elapse._0_4_ = (float)(((double)elapse._4_4_ / dStack_40) * 100.0);
  cpufrac = 18.0;
  elapcpu = (float)(18.0 / dStack_40);
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4032000000000000,dStack_40,(double)elapse._0_4_,
         (double)elapcpu);
  return *(int *)nremain;
}

Assistant:

int writesimage(fitsfile *fptr, int *status)

    /**************************************************/
    /* write the primary array containing a 2-D image */
    /**************************************************/
{
    long  nremain, ii;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* initialize FITS image parameters */
    int bitpix   =  16;   /* 16-bit  signed integer pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = {XSIZE, YSIZE }; /* image size */

    /* write the required keywords for the primary array image */
    if ( fits_create_img(fptr, bitpix, naxis, naxes, status) )
         printerror( *status );          

    printf("\nWrite %dx%d I*2 image, %d pixels/loop:   ",XSIZE,YSIZE,SHTSIZE);
    marktime(status);

    nremain = XSIZE * YSIZE;
    for (ii = 1; ii <= nremain; ii += SHTSIZE)
    {
      ffppri(fptr, 0, ii, SHTSIZE, ssarray, status);
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = XSIZE * 2. * YSIZE / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}